

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O2

void __thiscall hgdb::rtl::Serializer::handle(Serializer *this,InstanceSymbol *inst)

{
  SymbolTable *this_00;
  Module *this_01;
  Scope<std::nullptr_t> *pSVar1;
  ScopeBase *pSVar2;
  Definition *__k;
  iterator iVar3;
  mapped_type *ppMVar4;
  mapped_type m;
  Scope<std::nullptr_t> *pSVar5;
  string_view local_f8;
  path local_d0;
  string filename;
  path local_78;
  string local_50;
  
  __k = slang::ast::InstanceSymbol::getDefinition(inst);
  iVar3 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->definitions_)._M_h,&__k->name);
  if (iVar3.super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
      _M_cur == (__node_type *)0x0) {
    this_00 = this->table_;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_f8,&__k->name,(allocator<char> *)&local_d0);
    m = json::SymbolTable::add_module(this_00,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    ppMVar4 = std::__detail::
              _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&this->def_module_mapping_,&__k->name);
    m = *ppMVar4;
  }
  this_01 = this->current_module_;
  if (this_01 != (Module *)0x0) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_f8,&(inst->super_InstanceSymbolBase).super_Symbol.name,
               (allocator<char> *)&local_d0);
    json::Module::add_instance(this_01,(string *)&local_f8,m);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  if (iVar3.super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
      _M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>const&>
              ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->definitions_,__k);
    this->current_module_ = m;
    std::
    _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,hgdb::json::Module*&>
              ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->def_module_mapping_,__k,&this->current_module_);
    pSVar1 = this->current_scope_;
    pSVar2 = this->root_scope_;
    pSVar5 = json::Scope<hgdb::json::Module>::create_scope<hgdb::json::Scope<decltype(nullptr)>>
                       (&this->current_module_->super_Scope<hgdb::json::Module>);
    this->current_scope_ = pSVar5;
    local_f8 = slang::SourceManager::getFileName
                         (this->sm_,(inst->super_InstanceSymbolBase).super_Symbol.location);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&filename,&local_f8,(allocator<char> *)&local_d0);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_78,&filename,auto_format);
    std::filesystem::absolute(&local_d0);
    std::filesystem::canonical((path *)&local_f8);
    std::filesystem::__cxx11::path::string(&local_50,(path *)&local_f8);
    std::__cxx11::string::operator=((string *)&filename,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::filesystem::__cxx11::path::~path((path *)&local_f8);
    std::filesystem::__cxx11::path::~path(&local_d0);
    std::filesystem::__cxx11::path::~path(&local_78);
    std::__cxx11::string::string((string *)&local_f8,(string *)&filename);
    std::__cxx11::string::operator=((string *)&this->current_scope_->filename,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    this->root_scope_ = &this->current_scope_->super_ScopeBase;
    slang::ast::ASTVisitor<hgdb::rtl::Serializer,_true,_false>::
    visitDefault<slang::ast::InstanceSymbol>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)this,inst);
    this->current_module_ = this_01;
    this->current_scope_ = pSVar1;
    this->root_scope_ = pSVar2;
    std::__cxx11::string::~string((string *)&filename);
  }
  return;
}

Assistant:

void handle(const slang::ast::InstanceSymbol &inst) {
        auto const *def = &inst.getDefinition();
        hgdb::json::Module *inst_module = nullptr;
        auto visited = definitions_.find(def->name) != definitions_.end();
        if (!visited) {
            inst_module = table_.add_module(std::string(def->name));
        } else {
            inst_module = def_module_mapping_.at(def->name);
        }

        auto *parent_module = current_module_;

        if (parent_module) {
            parent_module->add_instance(std::string(inst.name), inst_module);
        }

        // only visit unique definition
        if (visited) return;
        definitions_.emplace(def->name);

        current_module_ = inst_module;
        def_module_mapping_.emplace(def->name, current_module_);

        auto *temp_current_scope_ = current_scope_;
        auto *temp_root_scope_ = root_scope_;
        // to make things easier, everything is wrapped in a single scope
        current_scope_ = current_module_->create_scope<hgdb::json::Scope<>>();
        auto filename = std::string(sm_.getFileName(inst.location));
        filename = std::filesystem::canonical(std::filesystem::absolute(filename)).string();
        current_scope_->filename = std::string(filename);
        root_scope_ = current_scope_;

        visitDefault(inst);
        // reset
        current_module_ = parent_module;
        current_scope_ = temp_current_scope_;
        root_scope_ = temp_root_scope_;
    }